

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O1

String * __thiscall
Console::Prompt::Private::getLine(String *__return_storage_ptr__,Private *this,String *prompt)

{
  usize *puVar1;
  List<String> *this_00;
  uint uVar2;
  uint *puVar3;
  conchar *data;
  code *pcVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  usize uVar8;
  int *piVar9;
  ssize_t sVar10;
  int iVar11;
  fd_set fdr;
  timeval tv;
  char buffer_1 [64];
  fd_set local_108;
  timeval local_88;
  char local_78 [72];
  
  if (this->valid != false) {
    redirectPendingData(this);
    enableTerminalRawMode(this);
    saveCursorPosition(this);
    stringToConcharArray(this,prompt,&this->prompt);
    puVar3 = (this->input)._begin.item;
    (this->historyPos).item = (this->history)._end.item;
    this->historyRemoveLast = false;
    if (puVar3 != (uint *)0x0) {
      (this->input)._end.item = puVar3;
    }
    this->inputComplete = false;
    this->caretPos = 0;
    local_108.fds_bits[0] = (__fd_mask)&String::emptyData;
    promptWrite(this,0,(String *)&local_108);
    if ((((String *)local_108.fds_bits[0])->_data).capacity != 0) {
      LOCK();
      puVar1 = &(((String *)local_108.fds_bits[0])->_data).capacity;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && ((Item *)local_108.fds_bits[0] != (Item *)0x0)) {
        operator_delete__((void *)local_108.fds_bits[0]);
      }
    }
    this_00 = &this->history;
LAB_00108861:
    do {
      do {
        if ((this->bufferedInput).bufferStart != (this->bufferedInput).bufferEnd) {
          uVar8 = readChar(this,(char *)&local_108);
          handleInput(this,(char *)&local_108,uVar8);
          if (this->inputComplete == false) goto LAB_00108861;
        }
        if (this->inputComplete != false) {
          promptClear(this);
          restoreCursorPosition(this);
          flushConsole(this);
          restoreTerminalMode(this);
          __return_storage_ptr__->data = &String::emptyData.super_Data;
          data = (this->input)._begin.item;
          concharArrayToString
                    (this,data,(long)(this->input)._end.item - (long)data >> 2,
                     __return_storage_ptr__);
          if (this->historyRemoveLast == true) {
            local_108.fds_bits[0] = (__fd_mask)((this_00->_end).item)->prev;
            List<String>::remove(this_00,(char *)&local_108);
          }
          if (__return_storage_ptr__->data->len == 0) {
            return __return_storage_ptr__;
          }
          List<String>::insert(this_00,&this_00->_end,__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        local_108.fds_bits[0xe] = 0;
        local_108.fds_bits[0xf] = 0;
        local_108.fds_bits[0xc] = 0;
        local_108.fds_bits[0xd] = 0;
        local_108.fds_bits[10] = 0;
        local_108.fds_bits[0xb] = 0;
        local_108.fds_bits[8] = 0;
        local_108.fds_bits[9] = 0;
        local_108.fds_bits[6] = 0;
        local_108.fds_bits[7] = 0;
        local_108.fds_bits[4] = 0;
        local_108.fds_bits[5] = 0;
        local_108.fds_bits[2] = 0;
        local_108.fds_bits[3] = 0;
        local_108.fds_bits[0] = 0;
        local_108.fds_bits[1] = 0;
        iVar6 = this->stdoutRead;
        iVar5 = iVar6 + 0x3f;
        if (-1 < iVar6) {
          iVar5 = iVar6;
        }
        local_108.fds_bits[iVar5 >> 6] = local_108.fds_bits[iVar5 >> 6] | 1L << ((byte)iVar6 & 0x3f)
        ;
        iVar5 = this->stderrRead;
        iVar11 = iVar5 + 0x3f;
        if (-1 < iVar5) {
          iVar11 = iVar5;
        }
        local_108.fds_bits[iVar11 >> 6] =
             local_108.fds_bits[iVar11 >> 6] | 1L << ((byte)iVar5 & 0x3f);
        local_108.fds_bits[0] = local_108.fds_bits[0] | 1;
        iVar11 = resizeEventFd + 0x3f;
        if (-1 < resizeEventFd) {
          iVar11 = resizeEventFd;
        }
        local_108.fds_bits[iVar11 >> 6] =
             local_108.fds_bits[iVar11 >> 6] | 1L << ((byte)resizeEventFd & 0x3f);
        if (iVar6 < iVar5) {
          iVar6 = iVar5;
        }
        if (iVar6 < resizeEventFd) {
          iVar6 = resizeEventFd;
        }
        local_88.tv_sec = 1000000;
        local_88.tv_usec = 0;
        flushConsole(this);
        iVar6 = select(iVar6 + 1,&local_108,(fd_set *)0x0,(fd_set *)0x0,&local_88);
      } while (iVar6 == 0);
      if (iVar6 != -1) {
        uVar2 = this->stdoutRead;
        uVar7 = uVar2 + 0x3f;
        if (-1 < (int)uVar2) {
          uVar7 = uVar2;
        }
        if (((ulong)local_108.fds_bits[(int)uVar7 >> 6] >> ((ulong)uVar2 & 0x3f) & 1) != 0) {
          handleOutput(this,uVar2,originalStdout);
        }
        uVar2 = this->stderrRead;
        uVar7 = uVar2 + 0x3f;
        if (-1 < (int)uVar2) {
          uVar7 = uVar2;
        }
        if (((ulong)local_108.fds_bits[(int)uVar7 >> 6] >> ((ulong)uVar2 & 0x3f) & 1) != 0) {
          handleOutput(this,uVar2,this->originalStderr);
        }
        if ((local_108.fds_bits[0] & 1U) != 0) {
          uVar8 = readChar(this,local_78);
          handleInput(this,local_78,uVar8);
        }
        iVar6 = resizeEventFd + 0x3f;
        if (-1 < resizeEventFd) {
          iVar6 = resizeEventFd;
        }
        if ((((ulong)local_108.fds_bits[iVar6 >> 6] >> ((ulong)(uint)resizeEventFd & 0x3f) & 1) != 0
            ) && (sVar10 = read(resizeEventFd,local_78,8), sVar10 == 8)) {
          uVar8 = getScreenWidth(this);
          handleResize(this,uVar8);
        }
        goto LAB_00108861;
      }
      piVar9 = __errno_location();
    } while (*piVar9 == 4);
    iVar6 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                          ,0x309,"false");
    if (iVar6 != 0) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
  }
  __return_storage_ptr__->data = &String::emptyData.super_Data;
  return __return_storage_ptr__;
}

Assistant:

String getLine(const String& prompt)
  {
    if(!valid)
    {
      // todo: print std and read line from stdin 
      return String();
    }

    // write pending stdout data
    redirectPendingData();

    //
    enableTerminalRawMode();
    saveCursorPosition();

    // initialize and write prompt
    stringToConcharArray(prompt, this->prompt);
    historyPos = history.end();
    historyRemoveLast = false;
    input.clear();
    inputComplete = false;
    caretPos = 0;
    promptWrite();

#ifdef _MSC_VER
    // wait for io
    HANDLE hStdIn = GetStdHandle(STD_INPUT_HANDLE);
    HANDLE handles[] = {hStdIn, outOverlapped.hEvent, errOverlapped.hEvent};
    while(!inputComplete)
    {
      DWORD dw = WaitForMultipleObjects(3, handles, FALSE, INFINITE);
      switch(dw)
      {
      case WAIT_OBJECT_0:
        {
          INPUT_RECORD records[1];
          DWORD read;
          VERIFY(ReadConsoleInput(hStdIn, records, 1, &read));
          usize keyEvents = 0;
          for(DWORD i = 0; i < read; ++i)
            switch(records[i].EventType)
            {
            case WINDOW_BUFFER_SIZE_EVENT:
              handleResize(records[i].Event.WindowBufferSizeEvent.dwSize.X);
              break;
            case KEY_EVENT:
              {
                const KEY_EVENT_RECORD& keyEvent = records[i].Event.KeyEvent;
                if(keyEvent.bKeyDown)
#ifdef _UNICODE
                  handleInput(keyEvent.uChar.UnicodeChar, keyEvent.wVirtualKeyCode);
#else
                  handleInput(keyEvent.uChar.AsciiChar, keyEvent.wVirtualKeyCode);
#endif
              }
              break;
            }
        }
        break;
      case WAIT_OBJECT_0 + 1:
        handleOutput(hStdOutRead, hOriginalStdOut, stdoutBuffer, sizeof(stdoutBuffer), outOverlapped);
        break;
      case WAIT_OBJECT_0 + 2:
        handleOutput(hStdErrRead, hOriginalStdErr, stderrBuffer, sizeof(stderrBuffer), errOverlapped);
        break;
      default:
        break;
      }
    }

#else
    for(;;)
    {
      while(!bufferedInput.isEmpty())
      {
        char buffer[64];
        usize len = readChar(buffer);
        handleInput(buffer, len);
        if(inputComplete)
          break;
      }
      if(inputComplete)
        break;

      fd_set fdr;
      FD_ZERO(&fdr);
      FD_SET(stdoutRead, &fdr);
      FD_SET(stderrRead, &fdr);
      FD_SET(STDIN_FILENO, &fdr);
      FD_SET(resizeEventFd, &fdr);
      int nfds = stdoutRead;
      if(stderrRead > nfds)
        nfds = stderrRead;
      if(resizeEventFd > nfds)
        nfds = resizeEventFd;
      timeval tv = {1000000, 0};
      flushConsole();
      switch(select(nfds + 1, &fdr, 0, 0, &tv))
      {
      case 0:
        continue;
      case -1:
        if(errno == EINTR)
          continue;
        ASSERT(false);
        return String();
      }
      if(FD_ISSET(stdoutRead, &fdr))
        handleOutput(stdoutRead, originalStdout);
      if(FD_ISSET(stderrRead, &fdr))
        handleOutput(stderrRead, originalStderr);
      if(FD_ISSET(STDIN_FILENO, &fdr))
      {
        char buffer[64];
        usize len = readChar(buffer);
        handleInput(buffer, len);
      }
      if(FD_ISSET(resizeEventFd, &fdr))
      {
        uint64 buffer;
        if(read(resizeEventFd, &buffer, sizeof(uint64)) == sizeof(uint64))
          handleResize(getScreenWidth());
      }
    }

#endif
    promptClear();
    restoreCursorPosition();
#ifndef _MSC_VER
    flushConsole();
#endif
    restoreTerminalMode();
    String result;
    concharArrayToString(input, input.size(), result);
    if(historyRemoveLast)
      history.removeBack();
    if(!result.isEmpty())
      history.append(result);
    return result;
  }